

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

int __thiscall Imf_3_4::Image::levelHeight(Image *this,int ly)

{
  int iVar1;
  ostream *poVar2;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  if ((-1 < ly) && (ly < (int)(this->_levels)._sizeX)) {
    iVar1 = anon_unknown_8::levelSize
                      ((this->_dataWindow).min.y,(this->_dataWindow).max.y,ly,
                       this->_levelRoundingMode);
    return iVar1;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_188,"Cannot get level height for invalid image level number ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,ly);
  std::operator<<(poVar2,".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

int
Image::levelHeight (int ly) const
{
    if (ly < 0 || ly >= numYLevels ())
    {
        THROW (
            ArgExc,
            "Cannot get level height for invalid "
            "image level number "
                << ly << ".");
    }

    return levelSize (
        _dataWindow.min.y, _dataWindow.max.y, ly, _levelRoundingMode);
}